

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::dump(DenseMatrix *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  real *prVar2;
  ostream *in_RSI;
  long in_RDI;
  int64_t j;
  int64_t i;
  DenseMatrix *this_01;
  long local_18;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RSI,*(long *)(in_RDI + 8));
  poVar1 = std::operator<<(poVar1," ");
  this_00 = (void *)std::ostream::operator<<(poVar1,*(long *)(in_RDI + 0x10));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; local_18 < *(long *)(in_RDI + 8); local_18 = local_18 + 1) {
    for (this_01 = (DenseMatrix *)0x0; (long)this_01 < *(long *)(in_RDI + 0x10);
        this_01 = (DenseMatrix *)((long)&(this_01->super_Matrix)._vptr_Matrix + 1)) {
      if (0 < (long)this_01) {
        std::operator<<(in_RSI," ");
      }
      poVar1 = in_RSI;
      prVar2 = at(this_01,in_RDI,(int64_t)in_RSI);
      std::ostream::operator<<(poVar1,*prVar2);
    }
    std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void DenseMatrix::dump(std::ostream& out) const {
  out << m_ << " " << n_ << std::endl;
  for (int64_t i = 0; i < m_; i++) {
    for (int64_t j = 0; j < n_; j++) {
      if (j > 0) {
        out << " ";
      }
      out << at(i, j);
    }
    out << std::endl;
  }
}